

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O1

int Llb_ManReachability(Llb_Man_t *p,Vec_Int_t *vHints,DdManager **pddGlo)

{
  Gia_ParLlb_t *pGVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  FILE *pFVar4;
  Vec_Int_t *vHints_00;
  DdNode *g;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  DdManager *pDVar9;
  DdNode *pDVar10;
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar11;
  DdNode *pDVar12;
  void **ppvVar13;
  DdNode *n_01;
  Abc_Cex_t *pAVar14;
  abctime aVar15;
  int iVar16;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar17;
  long lVar18;
  abctime time;
  uint uVar19;
  char *pcVar20;
  int level;
  Llb_Man_t *pLVar21;
  double dVar22;
  double dVar23;
  timespec ts;
  timespec local_80;
  Vec_Int_t *local_70;
  DdNode *local_68;
  DdManager **local_60;
  int *local_58;
  long local_50;
  long local_48;
  int *local_40;
  int *local_38;
  
  local_40 = p->vNs2Glo->pArray;
  local_38 = p->vCs2Glo->pArray;
  local_58 = p->vGlo2Cs->pArray;
  local_70 = vHints;
  iVar5 = clock_gettime(3,&local_80);
  if (iVar5 < 0) {
    lVar17 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  lVar8 = (long)p->pPars->TimeLimit;
  if (lVar8 == 0) {
    lVar18 = 0;
  }
  else {
    iVar5 = clock_gettime(3,&local_80);
    if (iVar5 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    lVar18 = lVar18 + lVar8 * 1000000;
  }
  p->pPars->TimeTarget = lVar18;
  Llb_ManPrepareVarLimits(p);
  if (p->dd != (DdManager *)0x0) {
    __assert_fail("p->dd == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,600,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  if (p->ddG != (DdManager *)0x0) {
    __assert_fail("p->ddG == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x259,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  if (p->ddR != (DdManager *)0x0) {
    __assert_fail("p->ddR == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x25a,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  pDVar9 = Cudd_Init(p->vVar2Obj->nSize,0,0x100,0x40000,0);
  p->dd = pDVar9;
  pDVar9 = Cudd_Init(p->pAig->nObjs[2],0,0x100,0x40000,0);
  p->ddR = pDVar9;
  if ((pddGlo == (DdManager **)0x0) || (*pddGlo == (DdManager *)0x0)) {
    pDVar9 = Cudd_Init(p->pAig->nRegs,0,0x100,0x40000,0);
    p->ddG = pDVar9;
  }
  else {
    p->ddG = *pddGlo;
    *pddGlo = (DdManager *)0x0;
  }
  if (p->pPars->fReorder == 0) {
    Cudd_AutodynDisable(p->dd);
    Cudd_AutodynDisable(p->ddG);
    Cudd_AutodynDisable(p->ddR);
  }
  else {
    Cudd_AutodynEnable(p->dd,CUDD_REORDER_SYMM_SIFT);
    Cudd_AutodynEnable(p->ddG,CUDD_REORDER_SYMM_SIFT);
    Cudd_AutodynEnable(p->ddR,CUDD_REORDER_SYMM_SIFT);
  }
  aVar15 = p->pPars->TimeTarget;
  p->dd->TimeStop = aVar15;
  p->ddG->TimeStop = aVar15;
  pDVar9 = p->ddR;
  pDVar9->TimeStop = aVar15;
  pDVar10 = Llb_BddComputeBad(p->pAigGlo,pDVar9,aVar15);
  p->ddR->bFunc = pDVar10;
  if (pDVar10 == (DdNode *)0x0) {
    if (p->pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) during constructing the bad states.\n",
             (ulong)(uint)p->pPars->TimeLimit);
    }
    p->pPars->iFrame = -1;
  }
  else {
    local_60 = pddGlo;
    Cudd_Ref(pDVar10);
    vHints_00 = local_70;
    n = Llb_ManCreateConstraints(p,local_70,0);
    Cudd_Ref(n);
    n_00 = Llb_ManCreateConstraints(p,vHints_00,1);
    Cudd_Ref(n_00);
    pDVar9 = p->ddG;
    pDVar10 = pDVar9->bFunc;
    if (pDVar10 == (DdNode *)0x0) {
      pDVar10 = Llb_ManComputeInitState(p,pDVar9);
      Cudd_Ref(pDVar10);
      pDVar11 = Llb_ManComputeInitState(p,p->dd);
    }
    else {
      pDVar9->bFunc = (DdNode *)0x0;
      pDVar11 = Extra_TransferPermute(pDVar9,p->dd,pDVar10,local_58);
    }
    Cudd_Ref(pDVar11);
    if (p->pPars->nIterMax < 1) {
      uVar19 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar19 = 0;
      local_50 = lVar17;
      do {
        iVar5 = clock_gettime(3,&local_80);
        if (iVar5 < 0) {
          lVar17 = 1;
        }
        else {
          lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
          lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_80.tv_sec * -1000000;
        }
        if (p->pPars->TimeLimit != 0) {
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar8 = -1;
          }
          else {
            lVar8 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          pGVar1 = p->pPars;
          if (lVar8 <= pGVar1->TimeTarget) goto LAB_0082e8d8;
          if (pGVar1->fSilent == 0) {
            uVar6 = pGVar1->TimeLimit;
            pcVar20 = "Reached timeout during image computation (%d seconds).\n";
            goto LAB_0082ef7f;
          }
LAB_0082ef86:
          p->pPars->iFrame = uVar19 - 1;
          pDVar12 = pDVar11;
LAB_0082ef8e:
          pDVar9 = p->dd;
LAB_0082ef95:
          Cudd_RecursiveDeref(pDVar9,pDVar12);
          Cudd_RecursiveDeref(p->dd,n);
          Cudd_RecursiveDeref(p->dd,n_00);
          pDVar9 = p->ddG;
          goto LAB_0082efbd;
        }
LAB_0082e8d8:
        local_48 = lVar17;
        pDVar12 = Extra_TransferPermute(p->dd,p->ddR,pDVar11,local_38);
        if (pDVar12 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            uVar6 = p->pPars->TimeLimit;
            pcVar20 = "Reached timeout (%d seconds) during ring transfer.\n";
LAB_0082ef7f:
            printf(pcVar20,(ulong)uVar6);
          }
          goto LAB_0082ef86;
        }
        local_68 = pDVar10;
        Cudd_Ref(pDVar12);
        pVVar2 = p->vRings;
        uVar7 = pVVar2->nCap;
        if (pVVar2->nSize == uVar7) {
          if ((int)uVar7 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc(0x80);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar13;
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar7 * 2;
            if (iVar5 <= (int)uVar7) goto LAB_0082e97f;
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc((ulong)uVar7 << 4);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar2->pArray,(ulong)uVar7 << 4);
            }
            pVVar2->pArray = ppvVar13;
          }
          pVVar2->nCap = iVar5;
        }
LAB_0082e97f:
        iVar5 = pVVar2->nSize;
        iVar16 = iVar5 + 1;
        pVVar2->nSize = iVar16;
        pVVar2->pArray[iVar5] = pDVar12;
        if (p->pPars->fSkipOutCheck == 0) {
          pDVar9 = p->ddR;
          iVar5 = Cudd_bddLeq(pDVar9,pDVar12,(DdNode *)((ulong)pDVar9->bFunc ^ 1));
          pDVar10 = local_68;
          level = (int)pDVar9;
          iVar16 = extraout_EDX;
          if (iVar5 == 0) {
            if (p->pAigGlo->pSeqModel == (Abc_Cex_t *)0x0) {
              if (p->pPars->fBackward == 0) {
                pLVar21 = p;
                pAVar14 = Llb_ManReachDeriveCex(p);
                level = (int)pLVar21;
                p->pAigGlo->pSeqModel = pAVar14;
              }
              if (p->pPars->fSilent == 0) {
                pAVar3 = p->pAigGlo;
                if (p->pPars->fBackward == 0) {
                  pcVar20 = "Output %d of miter \"%s\" was asserted in frame %d.  ";
                  Abc_Print(level,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                            (ulong)(uint)pAVar3->pSeqModel->iPo,pAVar3->pName,pAVar3->pName,uVar19);
                }
                else {
                  pcVar20 = 
                  "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  "
                  ;
                  Abc_Print(level,
                            "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  "
                            ,pAVar3->pName,uVar19);
                }
                aVar15 = Abc_Clock();
                Abc_PrintTime((int)local_50 + (int)aVar15,pcVar20,time);
              }
              p->pPars->iFrame = uVar19 - 1;
              Cudd_RecursiveDeref(p->dd,pDVar11);
              Cudd_RecursiveDeref(p->dd,n);
              Cudd_RecursiveDeref(p->dd,n_00);
              Cudd_RecursiveDeref(p->ddG,pDVar10);
              return 0;
            }
            __assert_fail("p->pAigGlo->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                          ,0x2b8,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
          }
        }
        pDVar10 = pDVar11;
        if (local_70 != (Vec_Int_t *)0x0) {
          pDVar10 = Cudd_bddAnd(p->dd,pDVar11,n);
          Cudd_Ref(pDVar10);
          Cudd_RecursiveDeref(p->dd,pDVar11);
          iVar16 = extraout_EDX_00;
        }
        g = local_68;
        if (p->vGroups->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pDVar11 = Llb_ManConstructQuantCubeIntern(p,(Llb_Grp_t *)*p->vGroups->pArray,iVar16,0);
        Cudd_Ref(pDVar11);
        pDVar12 = Cudd_bddExistAbstract(p->dd,pDVar10,pDVar11);
        Cudd_Ref(pDVar12);
        Cudd_RecursiveDeref(p->dd,pDVar10);
        Cudd_RecursiveDeref(p->dd,pDVar11);
        pDVar11 = Llb_ManComputeImage(p,pDVar12,0);
        pDVar10 = g;
        if (pDVar11 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar19 - 1;
          pDVar9 = p->dd;
          goto LAB_0082ef95;
        }
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->dd,pDVar12);
        pDVar12 = pDVar11;
        if (local_70 != (Vec_Int_t *)0x0) {
          pDVar12 = Cudd_bddAnd(p->dd,pDVar11,n_00);
          Cudd_Ref(pDVar12);
          Cudd_RecursiveDeref(p->dd,pDVar11);
        }
        n_01 = Extra_TransferPermute(p->dd,p->ddG,pDVar12,local_40);
        if (n_01 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar19 - 1;
          goto LAB_0082ef8e;
        }
        Cudd_Ref(n_01);
        Cudd_RecursiveDeref(p->dd,pDVar12);
        iVar5 = Cudd_bddLeq(p->ddG,n_01,g);
        if (iVar5 != 0) {
          pDVar9 = p->ddG;
LAB_0082ed85:
          Cudd_RecursiveDeref(pDVar9,n_01);
          pDVar11 = (DdNode *)0x0;
          break;
        }
        uVar6 = Cudd_DagSize(n_01);
        pDVar9 = p->ddG;
        if (p->pPars->nBddMax < (int)uVar6) goto LAB_0082ed85;
        pDVar12 = Cudd_bddAnd(pDVar9,n_01,(DdNode *)((ulong)g ^ 1));
        if (pDVar12 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(p->ddG,n_01);
          Cudd_RecursiveDeref(p->ddG,g);
          pDVar11 = (DdNode *)0x0;
          pDVar10 = (DdNode *)0x0;
          break;
        }
        Cudd_Ref(pDVar12);
        pDVar11 = Extra_TransferPermute(p->ddG,p->dd,pDVar12,local_58);
        if (pDVar11 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = uVar19 - 1;
          pDVar9 = p->ddG;
          goto LAB_0082ef95;
        }
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->ddG,pDVar12);
        pDVar10 = Cudd_bddOr(p->ddG,g,n_01);
        if (pDVar10 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(p->ddG,g);
          Cudd_RecursiveDeref(p->ddG,n_01);
          pDVar10 = (DdNode *)0x0;
          break;
        }
        Cudd_Ref(pDVar10);
        Cudd_RecursiveDeref(p->ddG,g);
        Cudd_RecursiveDeref(p->ddG,n_01);
        if (p->pPars->fVerbose != 0) {
          fprintf(_stdout,"F =%5d : ",(ulong)uVar19);
          local_68 = (DdNode *)CONCAT44(local_68._4_4_,uVar6);
          fprintf(_stdout,"Im =%6d  ",(ulong)uVar6);
          pFVar4 = _stdout;
          uVar6 = Cudd_ReadReorderings(p->dd);
          uVar7 = Cudd_ReadGarbageCollections(p->dd);
          fprintf(pFVar4,"(%4d %3d)   ",(ulong)uVar6,(ulong)uVar7);
          pFVar4 = _stdout;
          uVar6 = Cudd_DagSize(pDVar10);
          fprintf(pFVar4,"Rea =%6d  ",(ulong)uVar6);
          pFVar4 = _stdout;
          uVar6 = Cudd_ReadReorderings(p->ddG);
          uVar7 = Cudd_ReadGarbageCollections(p->ddG);
          fprintf(pFVar4,"(%4d%4d)   ",(ulong)uVar6,(ulong)uVar7);
          iVar16 = 3;
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          lVar17 = lVar17 + local_48;
          Abc_Print(iVar16,"%s =","Time");
          Abc_Print(iVar16,"%9.2f sec\n",(double)lVar17 / 1000000.0);
          uVar6 = (uint)local_68;
        }
        uVar19 = uVar19 + 1;
      } while ((int)uVar19 < p->pPars->nIterMax);
    }
    Cudd_RecursiveDeref(p->dd,n);
    Cudd_RecursiveDeref(p->dd,n_00);
    if (pDVar10 == (DdNode *)0x0) {
      p->pPars->iFrame = uVar19 - 1;
      return 0;
    }
    if (pDVar11 != (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,pDVar11);
    }
    if (p->pPars->fVerbose != 0) {
      local_70 = (Vec_Int_t *)Cudd_CountMinterm(p->ddG,pDVar10,p->pAig->nRegs);
      if ((int)uVar19 < p->pPars->nIterMax) {
        pcVar20 = "Reachability analysis completed after %d frames.\n";
        if (p->pPars->nBddMax < (int)uVar6) {
          pcVar20 = "Reachability analysis is stopped after %d frames.\n";
        }
      }
      else {
        pcVar20 = "Reachability analysis is stopped after %d frames.\n";
      }
      fprintf(_stdout,pcVar20,(ulong)uVar19);
      pFVar4 = _stdout;
      dVar22 = (double)local_70 * 100.0;
      dVar23 = ldexp(1.0,p->pAig->nRegs);
      fprintf(pFVar4,"Reachable states = %.0f. (Ratio = %.4f %%)\n",local_70,dVar22 / dVar23);
      fflush(_stdout);
    }
    pGVar1 = p->pPars;
    if (((int)uVar19 < pGVar1->nIterMax) && ((int)uVar6 <= pGVar1->nBddMax)) {
      pDVar9 = p->ddG;
      if (local_60 == (DdManager **)0x0) {
        Cudd_RecursiveDeref(pDVar9,pDVar10);
      }
      else {
        if (pDVar9->bFunc != (DdNode *)0x0) {
          __assert_fail("p->ddG->bFunc == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                        ,0x375,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
        }
        pDVar9->bFunc = pDVar10;
        if (*local_60 != (DdManager *)0x0) {
          __assert_fail("*pddGlo == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                        ,0x377,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
        }
        *local_60 = pDVar9;
        p->ddG = (DdManager *)0x0;
      }
      if (p->pPars->fSilent == 0) {
        printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar19);
      }
      p->pPars->iFrame = uVar19 - 1;
      return 1;
    }
    if (pGVar1->fSilent == 0) {
      printf("Verified only for states reachable in %d frames.  ",(ulong)uVar19);
    }
    p->pPars->iFrame = p->pPars->nIterMax;
    pDVar9 = p->ddG;
LAB_0082efbd:
    Cudd_RecursiveDeref(pDVar9,pDVar10);
  }
  return -1;
}

Assistant:

int Llb_ManReachability( Llb_Man_t * p, Vec_Int_t * vHints, DdManager ** pddGlo )
{
    int * pNs2Glo = Vec_IntArray( p->vNs2Glo );
    int * pCs2Glo = Vec_IntArray( p->vCs2Glo );
    int * pGlo2Cs = Vec_IntArray( p->vGlo2Cs );
    DdNode * bCurrent, * bReached, * bNext, * bTemp, * bCube;
    DdNode * bConstrCs, * bConstrNs;
    abctime clk2, clk = Abc_Clock();
    int nIters, nBddSize = 0;
//    int nThreshold = 10000;

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    // define variable limits
    Llb_ManPrepareVarLimits( p );

    // start the managers
    assert( p->dd == NULL );
    assert( p->ddG == NULL );
    assert( p->ddR == NULL );
    p->dd  = Cudd_Init( Vec_IntSize(p->vVar2Obj), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR = Cudd_Init( Aig_ManCiNum(p->pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    if ( pddGlo && *pddGlo )
        p->ddG = *pddGlo, *pddGlo = NULL; 
    else
        p->ddG = Cudd_Init( Aig_ManRegNum(p->pAig),   0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    if ( p->pPars->fReorder )
    {
        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
        Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    }
    else
    {
        Cudd_AutodynDisable( p->dd );
        Cudd_AutodynDisable( p->ddG );
        Cudd_AutodynDisable( p->ddR );
    }

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // create bad state in the ring manager
    p->ddR->bFunc  = Llb_BddComputeBad( p->pAigGlo, p->ddR, p->pPars->TimeTarget );          
    if ( p->ddR->bFunc == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    Cudd_Ref( p->ddR->bFunc );

    // derive constraints
    bConstrCs = Llb_ManCreateConstraints( p, vHints, 0 );   Cudd_Ref( bConstrCs );
    bConstrNs = Llb_ManCreateConstraints( p, vHints, 1 );   Cudd_Ref( bConstrNs );
//Extra_bddPrint( p->dd, bConstrCs ); printf( "\n" );
//Extra_bddPrint( p->dd, bConstrNs ); printf( "\n" );

    // perform reachability analysis
    // compute the starting set of states
    if ( p->ddG->bFunc )
    {
        bReached = p->ddG->bFunc; p->ddG->bFunc = NULL;
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bReached, pGlo2Cs );    Cudd_Ref( bCurrent );
    }
    else
    {
        bReached = Llb_ManComputeInitState( p, p->ddG );                         Cudd_Ref( bReached );
        bCurrent = Llb_ManComputeInitState( p, p->dd  );                         Cudd_Ref( bCurrent );
    }
//Extra_bddPrintSupport( p->ddG, bReached ); printf( "\n" );
//Extra_bddPrintSupport( p->dd,  bCurrent ); printf( "\n" );

//Extra_bddPrintSupport( p->dd, bCurrent ); printf( "\n" );
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clk2 = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout during image computation (%d seconds).\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, bCurrent, pCs2Glo );
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during ring transfer.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pAigGlo->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pAigGlo->pSeqModel = Llb_ManReachDeriveCex( p ); 
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pAigGlo->pSeqModel->iPo, p->pAigGlo->pName, p->pAigGlo->pName, nIters );
                else
                    Abc_Print( 1, "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  ", p->pAigGlo->pName, nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return 0; 
        }

        // restrict reachable states using constraints
        if ( vHints )
        {
            bCurrent = Cudd_bddAnd( p->dd, bTemp = bCurrent, bConstrCs );                                Cudd_Ref( bCurrent );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }

        // quantify variables appearing only in the init state
        bCube    = Llb_ManConstructQuantCubeIntern( p, (Llb_Grp_t *)Vec_PtrEntry(p->vGroups,0), 0, 0 );  Cudd_Ref( bCube );
        bCurrent = Cudd_bddExistAbstract( p->dd, bTemp = bCurrent, bCube );                              Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );

        // compute the next states
        bNext = Llb_ManComputeImage( p, bCurrent, 0 );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );   bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bCurrent ); bCurrent = NULL;

        // restrict reachable states using constraints
        if ( vHints )
        {
            bNext = Cudd_bddAnd( p->dd, bTemp = bNext, bConstrNs );                Cudd_Ref( bNext );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }
//Extra_bddPrintSupport( p->dd, bNext ); printf( "\n" );

        // remap these states into the current state vars
//        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pNs2Glo );    Cudd_Ref( bNext );
//        Cudd_RecursiveDeref( p->dd, bTemp );
//        bNext = Extra_TransferPermuteTime( p->dd, p->ddG, bTemp = bNext, pNs2Glo, p->pPars->TimeTarget );    
        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pNs2Glo );    
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bTemp );  
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bTemp );  


        // check if there are any new states
        if ( Cudd_bddLeq( p->ddG, bNext, bReached ) ) // implication = no new states
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // check the BDD size
        nBddSize = Cudd_DagSize(bNext);
        if ( nBddSize > p->pPars->nBddMax )
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // get the new states
        bCurrent = Cudd_bddAnd( p->ddG, bNext, Cudd_Not(bReached) );
        if ( bCurrent == NULL )
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );        bNext = NULL;
            Cudd_RecursiveDeref( p->ddG,  bReached );     bReached = NULL;
            break;
        }
        Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( p->ddG, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        bCurrent = Cudd_bddRestrict( p->ddG, bTemp = bCurrent, Cudd_Not(bReached) );  Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );
//printf( "Initial BDD =%7d. Constrained BDD =%7d.\n", Cudd_DagSize(bTemp), Cudd_DagSize(bCurrent) );

        // remap these states into the current state vars
//        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs );   Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );
//        bCurrent = Extra_TransferPermuteTime( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs, p->pPars->TimeTarget );    
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs );    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddG, bTemp ); 
        

        // add to the reached states
        bReached = Cudd_bddOr( p->ddG, bTemp = bReached, bNext );                       
        if ( bReached == NULL )
        {
            Cudd_RecursiveDeref( p->ddG,  bTemp );     bTemp = NULL;
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }
        Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        Cudd_RecursiveDeref( p->ddG, bNext );
        bNext = NULL;

        if ( p->pPars->fVerbose )
        {
            fprintf( stdout, "F =%5d : ",    nIters );
            fprintf( stdout, "Im =%6d  ",    nBddSize );
            fprintf( stdout, "(%4d %3d)   ", Cudd_ReadReorderings(p->dd),  Cudd_ReadGarbageCollections(p->dd) );
            fprintf( stdout, "Rea =%6d  ",   Cudd_DagSize(bReached) );
            fprintf( stdout, "(%4d%4d)   ",  Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
/*
        if ( p->pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->ddG, bReached );printf( "\n" );
            fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
*/
    }
    Cudd_RecursiveDeref( p->dd, bConstrCs ); bConstrCs = NULL;
    Cudd_RecursiveDeref( p->dd, bConstrNs ); bConstrNs = NULL;
    if ( bReached == NULL )
    {
        p->pPars->iFrame = nIters - 1;
        return 0; // reachable
    }
//    assert( bCurrent == NULL );
    if ( bCurrent )
        Cudd_RecursiveDeref( p->dd, bCurrent );
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        Cudd_RecursiveDeref( p->ddG, bReached );
        return -1; // undecided
    }
    if ( pddGlo ) 
    {
        assert( p->ddG->bFunc == NULL );
        p->ddG->bFunc = bReached; bReached = NULL;
        assert( *pddGlo == NULL );
        *pddGlo = p->ddG;  p->ddG = NULL;
    }
    else
        Cudd_RecursiveDeref( p->ddG, bReached );
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}